

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l10n.c
# Opt level: O0

l10n_arg * get_arg(l10n_arg *args,char *token)

{
  int iVar1;
  bool bVar2;
  int local_24;
  int i;
  char *token_local;
  l10n_arg *args_local;
  
  if (args == (l10n_arg *)0x0) {
    __assert_fail("args",
                  "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/l10n.c",
                  0x3e,"l10n_arg *get_arg(l10n_arg *, const char *)");
  }
  local_24 = 0;
  while( true ) {
    bVar2 = false;
    if (local_24 != 8) {
      bVar2 = args[local_24].name != (char *)0x0;
    }
    if (!bVar2) break;
    iVar1 = strcmp(args[local_24].name + 1,token);
    if (iVar1 == 0) {
      return args + local_24;
    }
    local_24 = local_24 + 1;
  }
  return (l10n_arg *)0x0;
}

Assistant:

static l10n_arg *get_arg(l10n_arg *args, const char *token)
{
    int i;

    assert(args);
    for (i = 0; i != NUM_ARGS && args[i].name; ++i) {
        if (strcmp(args[i].name + 1, token) == 0) {
            return args + i;
        }
    }
    return NULL;
}